

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

bool __thiscall
Assimp::FBX::FBXConverter::NeedsComplexTransformationChain(FBXConverter *this,Model *model)

{
  PropertyTable *in;
  char *pcVar1;
  ulong uVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar3;
  aiVector3t<float> aVar4;
  bool ok;
  bool local_6e;
  allocator local_6d;
  float local_6c;
  undefined1 local_68 [24];
  
  in = Model::Props(model);
  for (uVar2 = 0; uVar2 != 0x11; uVar2 = uVar2 + 1) {
    if (((TransformationComp)uVar2 &
        (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) !=
        TransformationComp_Translation && uVar2 != 0xc) {
      pcVar1 = NameTransformationCompProperty((FBXConverter *)model,(TransformationComp)uVar2);
      std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,pcVar1,&local_6d);
      aVar4 = PropertyGet<aiVector3t<float>>(in,(string *)&stack0xffffffffffffffb0,&local_6e,false);
      local_6c = aVar4.z;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = aVar4._0_8_;
      local_68._12_4_ = extraout_XMM0_Dd;
      model = (Model *)&stack0xffffffffffffffb0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      if (local_6e == true && uVar2 == 0x10) {
        fVar3 = (local_6c + -1.0) * (local_6c + -1.0) +
                ((float)local_68._0_4_ + -1.0) * ((float)local_68._0_4_ + -1.0) +
                ((float)local_68._4_4_ + -1.0) * ((float)local_68._4_4_ + -1.0);
      }
      else {
        if (local_6e == false) goto LAB_0015bf20;
        fVar3 = local_6c * local_6c +
                (float)local_68._0_4_ * (float)local_68._0_4_ +
                (float)local_68._4_4_ * (float)local_68._4_4_;
      }
      if (1e-06 < fVar3) break;
    }
LAB_0015bf20:
  }
  return uVar2 < 0x11;
}

Assistant:

bool FBXConverter::NeedsComplexTransformationChain(const Model& model)
        {
            const PropertyTable& props = model.Props();
            bool ok;

            const float zero_epsilon = 1e-6f;
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (comp == TransformationComp_Rotation || comp == TransformationComp_Scaling || comp == TransformationComp_Translation) {
                    continue;
                }

                bool scale_compare = (comp == TransformationComp_GeometricScaling || comp == TransformationComp_Scaling);

                const aiVector3D& v = PropertyGet<aiVector3D>(props, NameTransformationCompProperty(comp), ok);
                if (ok && scale_compare) {
                    if ((v - all_ones).SquareLength() > zero_epsilon) {
                        return true;
                    }
                } else if (ok) {
                    if (v.SquareLength() > zero_epsilon) {
                        return true;
                    }
                }
            }

            return false;
        }